

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderReturnTests.cpp
# Opt level: O3

void __thiscall
vkt::sr::anon_unknown_0::ShaderReturnCase::ShaderReturnCase
          (ShaderReturnCase *this,TestContext *testCtx,string *name,string *description,
          bool isVertexCase,string *shaderSource,ShaderEvalFunc evalFunc,UniformSetup *uniformFunc)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  undefined7 in_register_00000081;
  
  ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,name,description,isVertexCase,evalFunc,
             uniformFunc,(AttributeSetupFunc)0x0);
  (this->super_ShaderRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderRenderCase_00cf77b0;
  if ((int)CONCAT71(in_register_00000081,isVertexCase) == 0) {
    std::__cxx11::string::_M_assign((string *)&(this->super_ShaderRenderCase).m_fragShaderSource);
    pcVar2 = 
    "#version 310 es\nlayout(location = 0) in  highp   vec4 a_position;\nlayout(location = 1) in  highp   vec4 a_coords;\nlayout(location = 0) out mediump vec4 v_coords;\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_coords = a_coords;\n}\n"
    ;
    lVar1 = 0x78;
    lVar3 = 0x70;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&(this->super_ShaderRenderCase).m_vertShaderSource);
    pcVar2 = 
    "#version 310 es\nlayout(location = 0) in mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 o_color;\n\nvoid main (void)\n{\n    o_color = v_color;\n}\n"
    ;
    lVar1 = 0x98;
    lVar3 = 0x90;
  }
  std::__cxx11::string::_M_replace
            ((long)&(this->super_ShaderRenderCase).super_TestCase.super_TestCase.super_TestNode.
                    _vptr_TestNode + lVar3,0,
             *(char **)((long)&(this->super_ShaderRenderCase).super_TestCase.super_TestCase.
                               super_TestNode._vptr_TestNode + lVar1),(ulong)pcVar2);
  return;
}

Assistant:

ShaderReturnCase::ShaderReturnCase (tcu::TestContext&			testCtx,
									const std::string&			name,
									const std::string&			description,
									bool						isVertexCase,
									const std::string&			shaderSource,
									const ShaderEvalFunc		evalFunc,
									const UniformSetup*			uniformFunc)
	: ShaderRenderCase(testCtx, name, description, isVertexCase, evalFunc, uniformFunc, DE_NULL)
{
	if (isVertexCase)
	{
		m_vertShaderSource = shaderSource;
		m_fragShaderSource =
			"#version 310 es\n"
			"layout(location = 0) in mediump vec4 v_color;\n"
			"layout(location = 0) out mediump vec4 o_color;\n\n"
			"void main (void)\n"
			"{\n"
			"    o_color = v_color;\n"
			"}\n";
	}
	else
	{
		m_fragShaderSource = shaderSource;
		m_vertShaderSource =
			"#version 310 es\n"
			"layout(location = 0) in  highp   vec4 a_position;\n"
			"layout(location = 1) in  highp   vec4 a_coords;\n"
			"layout(location = 0) out mediump vec4 v_coords;\n\n"
			"void main (void)\n"
			"{\n"
			"    gl_Position = a_position;\n"
			"    v_coords = a_coords;\n"
			"}\n";
	}
}